

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParsePackage
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  LocationRecorder *this_00;
  bool bVar1;
  string *psVar2;
  Token *token;
  int local_94;
  undefined1 local_90 [8];
  string identifier;
  LocationRecorder location;
  allocator<char> local_49;
  string local_48;
  LocationRecorder *local_28;
  LocationRecorder *root_location_local;
  FileDescriptorProto *file_local;
  Parser *this_local;
  
  local_28 = root_location;
  root_location_local = (LocationRecorder *)file;
  file_local = (FileDescriptorProto *)this;
  bVar1 = FileDescriptorProto::has_package(file);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Multiple package definitions.",&local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    FileDescriptorProto::clear_package((FileDescriptorProto *)root_location_local);
  }
  bVar1 = Consume(this,"package");
  if (bVar1) {
    this_00 = (LocationRecorder *)((long)&identifier.field_2 + 8);
    LocationRecorder::LocationRecorder(this_00,local_28,2);
    LocationRecorder::RecordLegacyLocation(this_00,(Message *)root_location_local,NAME);
    do {
      std::__cxx11::string::string((string *)local_90);
      bVar1 = ConsumeIdentifier(this,(string *)local_90,"Expected identifier.");
      if (bVar1) {
        psVar2 = FileDescriptorProto::mutable_package_abi_cxx11_
                           ((FileDescriptorProto *)root_location_local);
        std::__cxx11::string::append((string *)psVar2);
        bVar1 = TryConsume(this,".");
        if (bVar1) {
          psVar2 = FileDescriptorProto::mutable_package_abi_cxx11_
                             ((FileDescriptorProto *)root_location_local);
          std::__cxx11::string::append((char *)psVar2);
          local_94 = 0;
        }
        else {
          local_94 = 3;
        }
      }
      else {
        this_local._7_1_ = 0;
        local_94 = 1;
      }
      std::__cxx11::string::~string((string *)local_90);
    } while (local_94 == 0);
    if (local_94 == 3) {
      token = io::Tokenizer::previous(this->input_);
      LocationRecorder::EndAt((LocationRecorder *)((long)&identifier.field_2 + 8),token);
      bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)((long)&identifier.field_2 + 8));
      if (bVar1) {
        local_94 = 0;
      }
      else {
        this_local._7_1_ = 0;
        local_94 = 1;
      }
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)((long)&identifier.field_2 + 8));
    if (local_94 == 0) {
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParsePackage(FileDescriptorProto* file,
                          const LocationRecorder& root_location) {
  if (file->has_package()) {
    AddError("Multiple package definitions.");
    // Don't append the new package to the old one.  Just replace it.  Not
    // that it really matters since this is an error anyway.
    file->clear_package();
  }

  DO(Consume("package"));

  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kPackageFieldNumber);
    location.RecordLegacyLocation(file, DescriptorPool::ErrorCollector::NAME);

    while (true) {
      string identifier;
      DO(ConsumeIdentifier(&identifier, "Expected identifier."));
      file->mutable_package()->append(identifier);
      if (!TryConsume(".")) break;
      file->mutable_package()->append(".");
    }

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }

  return true;
}